

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          *enum_generators,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  undefined4 uVar1;
  undefined8 this_00;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  *this_01;
  int iVar2;
  reference this_02;
  reference this_03;
  pointer local_70;
  undefined1 local_68 [28];
  int i_1;
  undefined1 local_38 [28];
  int i;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  *extension_generators_local;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  *enum_generators_local;
  MessageGenerator *this_local;
  
  local_38._20_4_ = 0;
  unique0x10000208 = extension_generators;
  extension_generators_local =
       (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
        *)enum_generators;
  enum_generators_local =
       (vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
        *)this;
  while( true ) {
    uVar1 = local_38._20_4_;
    iVar2 = Descriptor::enum_type_count(this->descriptor_);
    this_01 = extension_generators_local;
    if (iVar2 <= (int)uVar1) break;
    local_38._0_8_ = Descriptor::enum_type(this->descriptor_,local_38._20_4_);
    std::
    make_unique<google::protobuf::compiler::cpp::EnumGenerator,google::protobuf::EnumDescriptor_const*,google::protobuf::compiler::cpp::Options&>
              ((EnumDescriptor **)(local_38 + 8),(Options *)local_38);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                *)this_01,
               (unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                *)(local_38 + 8));
    std::
    unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                   *)(local_38 + 8));
    this_02 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
              ::back((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                      *)extension_generators_local);
    register0x00000000 =
         std::
         unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
         ::get(this_02);
    std::
    vector<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
    ::push_back(&this->enum_generators_,(value_type *)(local_68 + 0x18));
    local_38._20_4_ = local_38._20_4_ + 1;
  }
  local_68._20_4_ = 0;
  while( true ) {
    uVar1 = local_68._20_4_;
    iVar2 = Descriptor::extension_count(this->descriptor_);
    this_00 = stack0xffffffffffffffe0;
    if (iVar2 <= (int)uVar1) break;
    local_68._0_8_ = Descriptor::extension(this->descriptor_,local_68._20_4_);
    std::
    make_unique<google::protobuf::compiler::cpp::ExtensionGenerator,google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::cpp::Options&,google::protobuf::compiler::cpp::MessageSCCAnalyzer*&>
              ((FieldDescriptor **)(local_68 + 8),(Options *)local_68,
               (MessageSCCAnalyzer **)&this->options_);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
                *)this_00,
               (unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                *)(local_68 + 8));
    std::
    unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                   *)(local_68 + 8));
    this_03 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
              ::back((vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                      *)stack0xffffffffffffffe0);
    local_70 = std::
               unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::get(this_03);
    std::
    vector<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
    ::push_back(&this->extension_generators_,&local_70);
    local_68._20_4_ = local_68._20_4_ + 1;
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<std::unique_ptr<EnumGenerator>>* enum_generators,
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); ++i) {
    enum_generators->emplace_back(
        std::make_unique<EnumGenerator>(descriptor_->enum_type(i), options_));
    enum_generators_.push_back(enum_generators->back().get());
  }
  for (int i = 0; i < descriptor_->extension_count(); ++i) {
    extension_generators->emplace_back(std::make_unique<ExtensionGenerator>(
        descriptor_->extension(i), options_, scc_analyzer_));
    extension_generators_.push_back(extension_generators->back().get());
  }
}